

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
ManchesterAnalyzerSettings::LoadSettings(ManchesterAnalyzerSettings *this,char *settings)

{
  byte bVar1;
  int iVar2;
  ManchesterTolerance local_3c;
  char *pcStack_38;
  ManchesterTolerance tolerance;
  char *name_string;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  ManchesterAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&stack0xffffffffffffffc8);
  iVar2 = strcmp(pcStack_38,"SaleaeManchesterAnalyzer");
  if (iVar2 != 0) {
    AnalyzerHelpers::Assert
              (
              "SaleaeManchesterAnalyzer: Provided with a settings string that doesn\'t belong to us;"
              );
  }
  SimpleArchive::operator>>(local_20,&this->mInputChannel);
  SimpleArchive::operator>>(local_20,&this->mMode);
  SimpleArchive::operator>>(local_20,&this->mBitRate);
  SimpleArchive::operator>>(local_20,&this->mInverted);
  SimpleArchive::operator>>(local_20,&this->mBitsPerTransfer);
  SimpleArchive::operator>>(local_20,&this->mShiftOrder);
  SimpleArchive::operator>>(local_20,&this->mBitsToIgnore);
  bVar1 = SimpleArchive::operator>>(local_20,&local_3c);
  if ((bVar1 & 1) != 0) {
    this->mTolerance = local_3c;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void ManchesterAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeManchesterAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeManchesterAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mInputChannel;
    text_archive >> *( U32* )&mMode;
    text_archive >> mBitRate;
    text_archive >> mInverted;
    text_archive >> mBitsPerTransfer;
    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> mBitsToIgnore;

    ManchesterTolerance tolerance;
    if( text_archive >> *( U32* )&tolerance )
        mTolerance = tolerance;

    ClearChannels();
    AddChannel( mInputChannel, "Manchester", true );

    UpdateInterfacesFromSettings();
}